

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::TrackEvent::ParseFromArray(TrackEvent *this,void *raw,size_t size)

{
  byte bVar1;
  pointer puVar2;
  pointer plVar3;
  pointer pdVar4;
  pointer pDVar5;
  pointer pDVar6;
  uint uVar7;
  undefined1 uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar13;
  bool bVar14;
  uint *puVar15;
  ulong uVar16;
  uint *puVar17;
  uint uVar18;
  uint *puVar19;
  uint *puVar20;
  uint *puVar21;
  pointer pDVar22;
  uint *puVar23;
  bool bVar24;
  Field local_b8;
  uint *local_a8;
  uint *local_a0;
  uint *local_98;
  TrackEvent *local_90;
  string *local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_78;
  vector<double,_std::allocator<double>_> *local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_68;
  vector<long,_std::allocator<long>_> *local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  vector<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
  *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  puVar2 = (this->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (this->category_iids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_finish = puVar2;
  }
  local_38 = &this->categories_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_38,(this->categories_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  puVar2 = (this->extra_counter_track_uuids_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->extra_counter_track_uuids_).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->extra_counter_track_uuids_).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  plVar3 = (this->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
      super__Vector_impl_data._M_finish != plVar3) {
    (this->extra_counter_values_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data._M_finish = plVar3;
  }
  puVar2 = (this->extra_double_counter_track_uuids_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->extra_double_counter_track_uuids_).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->extra_double_counter_track_uuids_).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  pdVar4 = (this->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish != pdVar4) {
    (this->extra_double_counter_values_).super__Vector_base<double,_std::allocator<double>_>._M_impl
    .super__Vector_impl_data._M_finish = pdVar4;
  }
  puVar2 = (this->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  puVar2 = (this->terminating_flow_ids_).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->terminating_flow_ids_).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->terminating_flow_ids_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  pDVar5 = (this->debug_annotations_).
           super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar6 = (this->debug_annotations_).
           super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar13 = extraout_RDX;
  pDVar22 = pDVar5;
  if (pDVar6 != pDVar5) {
    do {
      (**(pDVar22->super_CppMessageObj)._vptr_CppMessageObj)(pDVar22);
      pDVar22 = pDVar22 + 1;
    } while (pDVar22 != pDVar6);
    (this->debug_annotations_).
    super__Vector_base<perfetto::protos::gen::DebugAnnotation,_std::allocator<perfetto::protos::gen::DebugAnnotation>_>
    ._M_impl.super__Vector_impl_data._M_finish = pDVar5;
    puVar13 = extraout_RDX_00;
  }
  local_50 = &this->category_iids_;
  local_58 = &this->extra_counter_track_uuids_;
  local_60 = &this->extra_counter_values_;
  local_68 = &this->extra_double_counter_track_uuids_;
  local_70 = &this->extra_double_counter_values_;
  local_78 = &this->flow_ids_;
  local_80 = &this->terminating_flow_ids_;
  local_40 = &this->debug_annotations_;
  local_48 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar23 = (uint *)(size + (long)raw);
  do {
    lVar12 = 7;
    if (puVar23 <= raw) goto LAB_00260faa;
    uVar16 = (ulong)(char)(byte)*raw;
    puVar21 = (uint *)((long)raw + 1);
    if ((long)uVar16 < 0) {
      bVar1 = (byte)*raw;
      uVar10 = (ulong)(bVar1 & 0x7f);
      bVar14 = false;
      puVar17 = puVar21;
      for (lVar11 = lVar12;
          (puVar19 = puVar17, uVar16 = uVar10, (char)bVar1 < '\0' &&
          (bVar24 = 0x38 < lVar11 - 7U, bVar14 = bVar24 || puVar23 <= puVar17, puVar13 = puVar17,
          puVar19 = puVar21, uVar16 = 0, !bVar24 && puVar23 > puVar17)); lVar11 = lVar11 + 7) {
        bVar1 = (byte)*puVar17;
        puVar17 = (uint *)((long)puVar17 + 1);
        uVar10 = uVar10 | (ulong)(bVar1 & 0x7f) << ((byte)lVar11 & 0x3f);
        puVar13 = puVar17;
      }
      puVar21 = puVar19;
      if (bVar14) {
        puVar21 = (uint *)raw;
        uVar16 = 0;
      }
      if (puVar21 == (uint *)raw) goto LAB_00260faa;
    }
    uVar9 = (uint)(uVar16 >> 3);
    if ((uVar9 == 0) || (puVar23 <= puVar21)) {
switchD_00260e21_caseD_3:
      bVar14 = false;
      uVar16 = 0;
      local_b8.int_value_ = (uint64_t)(uint *)0x0;
    }
    else {
      switch((uint)uVar16 & 7) {
      case 0:
        puVar15 = (uint *)0x0;
        bVar14 = puVar21 >= puVar23;
        if (puVar21 < puVar23) {
          puVar13 = (uint *)((long)puVar21 + 1);
          puVar17 = (uint *)(ulong)((byte)*puVar21 & 0x7f);
          puVar19 = puVar17;
          uVar18 = 0;
          if ((char)(byte)*puVar21 < '\0') {
            puVar19 = (uint *)0x0;
            uVar18 = 0;
            lVar12 = 7;
            puVar20 = puVar13;
            do {
              bVar24 = 0x38 < lVar12 - 7U;
              bVar14 = bVar24 || puVar23 <= puVar20;
              if (bVar24 || puVar23 <= puVar20) goto LAB_00260fb1;
              uVar7 = *puVar20;
              puVar20 = (uint *)((long)puVar20 + 1);
              puVar17 = (uint *)((ulong)puVar17 |
                                (ulong)((byte)uVar7 & 0x7f) << ((byte)lVar12 & 0x3f));
              lVar12 = lVar12 + 7;
            } while ((char)(byte)uVar7 < '\0');
            puVar19 = (uint *)((ulong)puVar17 & 0xffffffff);
            puVar13 = puVar20;
            uVar18 = (uint)((ulong)puVar17 >> 0x20);
          }
        }
        else {
          puVar19 = (uint *)0x0;
          uVar18 = 0;
        }
LAB_00260fb1:
        puVar17 = (uint *)(ulong)uVar18;
        if (bVar14) {
          puVar13 = puVar21;
          puVar17 = puVar15;
          puVar19 = puVar15;
        }
        local_a8 = puVar21;
        local_98 = (uint *)raw;
        if (puVar13 != puVar21) goto LAB_00260fd9;
        uVar16 = 0;
        bVar14 = false;
        local_b8.int_value_ = (uint64_t)puVar15;
        goto LAB_0026101b;
      case 1:
        puVar13 = puVar21 + 2;
        if (puVar23 < puVar13) {
LAB_00260faa:
          uVar16 = 0;
          bVar14 = false;
          local_b8.int_value_ = (uint64_t)(uint *)0x0;
          goto LAB_0026101b;
        }
        puVar19 = *(uint **)puVar21;
        puVar17 = (uint *)((ulong)puVar19 >> 0x20);
        break;
      case 2:
        bVar14 = puVar21 >= puVar23;
        puVar17 = local_a0;
        if (puVar21 < puVar23) {
          bVar1 = (byte)*puVar21;
          puVar15 = (uint *)(ulong)(bVar1 & 0x7f);
          puVar19 = (uint *)((long)puVar21 + 1U);
          for (; (puVar13 = puVar19, puVar17 = puVar15, (char)bVar1 < '\0' &&
                 (bVar24 = 0x38 < lVar12 - 7U, bVar14 = bVar24 || puVar23 <= puVar19,
                 puVar13 = (uint *)((long)puVar21 + 1U), puVar17 = local_a0,
                 !bVar24 && puVar23 > puVar19)); lVar12 = lVar12 + 7) {
            bVar1 = (byte)*puVar19;
            puVar19 = (uint *)((long)puVar19 + 1);
            puVar15 = (uint *)((ulong)puVar15 | (ulong)(bVar1 & 0x7f) << ((byte)lVar12 & 0x3f));
          }
        }
        local_a0 = puVar17;
        if (bVar14) {
          puVar13 = puVar21;
          local_a0 = (uint *)0x0;
        }
        if ((puVar13 == puVar21) || ((uint *)((long)puVar23 - (long)puVar13) < local_a0)) {
          puVar17 = (uint *)0x0;
          puVar19 = (uint *)0x0;
          bVar14 = false;
          puVar15 = (uint *)0x0;
        }
        else {
          puVar17 = (uint *)((ulong)puVar13 >> 0x20);
          puVar19 = (uint *)((ulong)puVar13 & 0xffffffff);
          puVar13 = (uint *)((long)puVar13 + (long)local_a0);
          bVar14 = true;
          puVar15 = local_a0;
        }
        local_a8 = puVar21;
        if (!bVar14) goto LAB_00260faa;
        goto LAB_00260fd9;
      default:
        goto switchD_00260e21_caseD_3;
      case 5:
        puVar13 = puVar21 + 1;
        puVar17 = (uint *)0x0;
        if (puVar23 < puVar13) goto LAB_00260faa;
        puVar19 = (uint *)(ulong)*puVar21;
      }
      puVar15 = (uint *)0x0;
LAB_00260fd9:
      bVar14 = true;
      raw = puVar13;
      if ((uVar9 < 0x10000) && (puVar15 < (uint *)0x10000000)) {
        local_b8.int_value_ = (ulong)puVar19 & 0xffffffff | (long)puVar17 << 0x20;
        uVar16 = (ulong)puVar15 | (uVar16 >> 3) << 0x20 | (ulong)((uint)uVar16 & 7) << 0x30;
        bVar14 = false;
      }
      else {
        local_b8.int_value_ = 0;
        uVar16 = 0;
      }
    }
LAB_0026101b:
    puVar21 = &switchD_00260e21::switchdataD_0034ee40;
    if (!bVar14) {
      local_b8.size_ = (uint32_t)uVar16;
      local_b8.type_ = (uint8_t)(uVar16 >> 0x30);
      local_b8.id_ = (uint16_t)(uVar16 >> 0x20);
      if (local_b8.id_ != 0) {
        local_88 = &this->name_;
        local_90 = this;
        do {
          if ((ushort)(uVar16 >> 0x20) < 0x2f) {
            (this->_has_field_).super__Base_bitset<1UL>._M_w =
                 (this->_has_field_).super__Base_bitset<1UL>._M_w |
                 1L << ((byte)(uVar16 >> 0x20) & 0x3f);
          }
          uVar9 = ((uint)(uVar16 >> 0x20) & 0xffff) - 1;
          if (uVar9 < 0x2e) {
            uVar8 = (*(code *)(&DAT_0034ee58 + *(int *)(&DAT_0034ee58 + (ulong)uVar9 * 4)))();
            return (bool)uVar8;
          }
          protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_b8,local_48);
          do {
            if (puVar23 <= raw) goto LAB_0026176f;
            uVar16 = (ulong)(char)(byte)*raw;
            puVar13 = (uint *)((long)raw + 1);
            if ((long)uVar16 < 0) {
              uVar10 = (ulong)((byte)*raw & 0x7f);
              bVar14 = false;
              uVar16 = uVar10;
              puVar17 = puVar13;
              if ((char)(byte)*raw < '\0') {
                lVar12 = 7;
                puVar19 = puVar13;
                do {
                  bVar14 = 0x38 < lVar12 - 7U || puVar23 <= puVar19;
                  uVar16 = 0;
                  puVar17 = puVar13;
                  if (bVar14) break;
                  uVar9 = *puVar19;
                  puVar17 = (uint *)((long)puVar19 + 1);
                  uVar10 = uVar10 | (ulong)((byte)uVar9 & 0x7f) << ((byte)lVar12 & 0x3f);
                  lVar12 = lVar12 + 7;
                  uVar16 = uVar10;
                  puVar19 = puVar17;
                } while ((char)(byte)uVar9 < '\0');
              }
              puVar13 = puVar17;
              if (bVar14) {
                puVar13 = (uint *)raw;
                uVar16 = 0;
              }
              if (puVar13 == (uint *)raw) goto LAB_0026176f;
            }
            uVar9 = (uint)(uVar16 >> 3);
            if ((uVar9 == 0) || (puVar23 <= puVar13)) {
switchD_002615ba_caseD_3:
              bVar14 = false;
              uVar16 = 0;
              local_b8.int_value_ = (uint64_t)(uint *)0x0;
            }
            else {
              switch((uint)uVar16 & 7) {
              case 0:
                puVar15 = (uint *)0x0;
                bVar14 = puVar13 >= puVar23;
                if (puVar13 < puVar23) {
                  puVar17 = (uint *)((long)puVar13 + 1);
                  uVar18 = (byte)*puVar13 & 0x7f;
                  uVar10 = (ulong)uVar18;
                  puVar19 = (uint *)(ulong)uVar18;
                  puVar21 = puVar17;
                  uVar18 = 0;
                  if ((char)(byte)*puVar13 < '\0') {
                    puVar19 = (uint *)0x0;
                    lVar12 = 7;
                    puVar20 = puVar17;
                    do {
                      bVar24 = 0x38 < lVar12 - 7U;
                      bVar14 = bVar24 || puVar23 <= puVar20;
                      puVar21 = puVar17;
                      uVar18 = 0;
                      if (bVar24 || puVar23 <= puVar20) break;
                      bVar1 = (byte)*puVar20;
                      puVar20 = (uint *)((long)puVar20 + 1);
                      uVar10 = uVar10 | (ulong)(bVar1 & 0x7f) << ((byte)lVar12 & 0x3f);
                      lVar12 = lVar12 + 7;
                      if (-1 < (char)bVar1) {
                        puVar19 = (uint *)(uVar10 & 0xffffffff);
                      }
                      puVar21 = puVar20;
                      uVar18 = (uint)(uVar10 >> 0x20);
                    } while (-1 >= (char)bVar1);
                  }
                }
                else {
                  puVar19 = (uint *)0x0;
                  uVar18 = 0;
                }
                if (bVar14) {
                  puVar19 = puVar15;
                }
                puVar17 = (uint *)(ulong)uVar18;
                if (bVar14) {
                  puVar21 = puVar13;
                  puVar17 = puVar15;
                }
                this = local_90;
                local_a0 = puVar13;
                local_98 = (uint *)raw;
                if (puVar21 != puVar13) goto LAB_0026179a;
                uVar16 = 0;
                bVar14 = false;
                local_b8.int_value_ = (uint64_t)puVar15;
                goto LAB_002617e5;
              case 1:
                puVar21 = puVar13 + 2;
                if (puVar23 < puVar21) {
LAB_0026176f:
                  uVar16 = 0;
                  bVar14 = false;
                  local_b8.int_value_ = (uint64_t)(uint *)0x0;
                  goto LAB_002617e5;
                }
                puVar19 = *(uint **)puVar13;
                puVar17 = (uint *)((ulong)puVar19 >> 0x20);
                break;
              case 2:
                bVar14 = puVar13 >= puVar23;
                puVar17 = local_a8;
                if (puVar13 < puVar23) {
                  puVar19 = (uint *)((long)puVar13 + 1);
                  puVar15 = (uint *)(ulong)((byte)*puVar13 & 0x7f);
                  puVar21 = puVar19;
                  puVar17 = puVar15;
                  if ((char)(byte)*puVar13 < '\0') {
                    lVar12 = 7;
                    puVar20 = puVar19;
                    do {
                      bVar14 = 0x38 < lVar12 - 7U || puVar23 <= puVar20;
                      puVar21 = puVar19;
                      puVar17 = local_a8;
                      if (bVar14) break;
                      uVar18 = *puVar20;
                      puVar20 = (uint *)((long)puVar20 + 1);
                      puVar15 = (uint *)((ulong)puVar15 |
                                        (ulong)((byte)uVar18 & 0x7f) << ((byte)lVar12 & 0x3f));
                      lVar12 = lVar12 + 7;
                      puVar21 = puVar20;
                      puVar17 = puVar15;
                    } while ((char)(byte)uVar18 < '\0');
                  }
                }
                local_a8 = puVar17;
                if (bVar14) {
                  puVar21 = puVar13;
                  local_a8 = (uint *)0x0;
                }
                if ((puVar21 == puVar13) || ((uint *)((long)puVar23 - (long)puVar21) < local_a8)) {
                  puVar19 = (uint *)0x0;
                  puVar17 = (uint *)0x0;
                  bVar14 = false;
                  puVar15 = (uint *)0x0;
                }
                else {
                  puVar17 = (uint *)((ulong)puVar21 >> 0x20);
                  puVar19 = (uint *)((ulong)puVar21 & 0xffffffff);
                  puVar21 = (uint *)((long)puVar21 + (long)local_a8);
                  bVar14 = true;
                  puVar15 = local_a8;
                }
                local_a0 = puVar13;
                if (!bVar14) goto LAB_0026176f;
                goto LAB_0026179a;
              default:
                goto switchD_002615ba_caseD_3;
              case 5:
                puVar21 = puVar13 + 1;
                puVar17 = (uint *)0x0;
                if (puVar23 < puVar21) goto LAB_0026176f;
                puVar19 = (uint *)(ulong)*puVar13;
              }
              puVar15 = (uint *)0x0;
LAB_0026179a:
              raw = puVar21;
              bVar14 = true;
              puVar21 = (uint *)raw;
              if ((uVar9 < 0x10000) && (puVar15 < (uint *)0x10000000)) {
                local_b8.int_value_ = (ulong)puVar19 & 0xffffffff | (long)puVar17 << 0x20;
                uVar16 = (ulong)puVar15 | (uVar16 >> 3) << 0x20 | (uVar16 & 7) << 0x30;
                bVar14 = false;
              }
              else {
                local_b8.int_value_ = 0;
                uVar16 = 0;
              }
            }
LAB_002617e5:
          } while (bVar14);
          local_b8.size_ = (uint32_t)uVar16;
          local_b8.type_ = (uint8_t)(uVar16 >> 0x30);
          local_b8.id_ = (uint16_t)(uVar16 >> 0x20);
        } while (local_b8.id_ != 0);
      }
      return puVar23 == (uint *)raw;
    }
  } while( true );
}

Assistant:

bool TrackEvent::ParseFromArray(const void* raw, size_t size) {
  category_iids_.clear();
  categories_.clear();
  extra_counter_track_uuids_.clear();
  extra_counter_values_.clear();
  extra_double_counter_track_uuids_.clear();
  extra_double_counter_values_.clear();
  flow_ids_.clear();
  terminating_flow_ids_.clear();
  debug_annotations_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 3 /* category_iids */:
        category_iids_.emplace_back();
        field.get(&category_iids_.back());
        break;
      case 22 /* categories */:
        categories_.emplace_back();
        field.get(&categories_.back());
        break;
      case 10 /* name_iid */:
        field.get(&name_iid_);
        break;
      case 23 /* name */:
        field.get(&name_);
        break;
      case 9 /* type */:
        field.get(&type_);
        break;
      case 11 /* track_uuid */:
        field.get(&track_uuid_);
        break;
      case 30 /* counter_value */:
        field.get(&counter_value_);
        break;
      case 44 /* double_counter_value */:
        field.get(&double_counter_value_);
        break;
      case 31 /* extra_counter_track_uuids */:
        extra_counter_track_uuids_.emplace_back();
        field.get(&extra_counter_track_uuids_.back());
        break;
      case 12 /* extra_counter_values */:
        extra_counter_values_.emplace_back();
        field.get(&extra_counter_values_.back());
        break;
      case 45 /* extra_double_counter_track_uuids */:
        extra_double_counter_track_uuids_.emplace_back();
        field.get(&extra_double_counter_track_uuids_.back());
        break;
      case 46 /* extra_double_counter_values */:
        extra_double_counter_values_.emplace_back();
        field.get(&extra_double_counter_values_.back());
        break;
      case 36 /* flow_ids */:
        flow_ids_.emplace_back();
        field.get(&flow_ids_.back());
        break;
      case 42 /* terminating_flow_ids */:
        terminating_flow_ids_.emplace_back();
        field.get(&terminating_flow_ids_.back());
        break;
      case 4 /* debug_annotations */:
        debug_annotations_.emplace_back();
        debug_annotations_.back().ParseFromArray(field.data(), field.size());
        break;
      case 5 /* task_execution */:
        (*task_execution_).ParseFromArray(field.data(), field.size());
        break;
      case 21 /* log_message */:
        (*log_message_).ParseFromArray(field.data(), field.size());
        break;
      case 24 /* cc_scheduler_state */:
        (*cc_scheduler_state_).ParseFromArray(field.data(), field.size());
        break;
      case 25 /* chrome_user_event */:
        (*chrome_user_event_).ParseFromArray(field.data(), field.size());
        break;
      case 26 /* chrome_keyed_service */:
        (*chrome_keyed_service_).ParseFromArray(field.data(), field.size());
        break;
      case 27 /* chrome_legacy_ipc */:
        (*chrome_legacy_ipc_).ParseFromArray(field.data(), field.size());
        break;
      case 28 /* chrome_histogram_sample */:
        (*chrome_histogram_sample_).ParseFromArray(field.data(), field.size());
        break;
      case 29 /* chrome_latency_info */:
        (*chrome_latency_info_).ParseFromArray(field.data(), field.size());
        break;
      case 32 /* chrome_frame_reporter */:
        (*chrome_frame_reporter_).ParseFromArray(field.data(), field.size());
        break;
      case 39 /* chrome_application_state_info */:
        (*chrome_application_state_info_).ParseFromArray(field.data(), field.size());
        break;
      case 40 /* chrome_renderer_scheduler_state */:
        (*chrome_renderer_scheduler_state_).ParseFromArray(field.data(), field.size());
        break;
      case 41 /* chrome_window_handle_event_info */:
        (*chrome_window_handle_event_info_).ParseFromArray(field.data(), field.size());
        break;
      case 43 /* chrome_content_settings_event_info */:
        (*chrome_content_settings_event_info_).ParseFromArray(field.data(), field.size());
        break;
      case 33 /* source_location */:
        (*source_location_).ParseFromArray(field.data(), field.size());
        break;
      case 34 /* source_location_iid */:
        field.get(&source_location_iid_);
        break;
      case 35 /* chrome_message_pump */:
        (*chrome_message_pump_).ParseFromArray(field.data(), field.size());
        break;
      case 38 /* chrome_mojo_event_info */:
        (*chrome_mojo_event_info_).ParseFromArray(field.data(), field.size());
        break;
      case 1 /* timestamp_delta_us */:
        field.get(&timestamp_delta_us_);
        break;
      case 16 /* timestamp_absolute_us */:
        field.get(&timestamp_absolute_us_);
        break;
      case 2 /* thread_time_delta_us */:
        field.get(&thread_time_delta_us_);
        break;
      case 17 /* thread_time_absolute_us */:
        field.get(&thread_time_absolute_us_);
        break;
      case 8 /* thread_instruction_count_delta */:
        field.get(&thread_instruction_count_delta_);
        break;
      case 20 /* thread_instruction_count_absolute */:
        field.get(&thread_instruction_count_absolute_);
        break;
      case 6 /* legacy_event */:
        (*legacy_event_).ParseFromArray(field.data(), field.size());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}